

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniserver.c
# Opt level: O0

void handle_request(void *args)

{
  uint sockfd;
  int iVar1;
  SOCKET connfd;
  mserv_request_t *request;
  http_message_t *phStack_2a0;
  int timeout;
  http_message_t *hmsg;
  http_parser_t parser;
  int minor;
  int major;
  int ret_code;
  int http_error_code;
  SOCKINFO info;
  void *args_local;
  
  parser.scanner._20_4_ = 1;
  parser.scanner.entire_msg_loaded = 1;
  phStack_2a0 = (http_message_t *)0x0;
  request._4_4_ = 0x1e;
  sockfd = *args;
  info.foreign_sockaddr.__ss_align = (unsigned_long)args;
  UpnpPrintf(UPNP_INFO,MSERV,".upnp/src/genlib/miniserver/miniserver.c",0x195,
             "miniserver %d: READING\n",(ulong)sockfd);
  phStack_2a0 = (http_message_t *)&hmsg;
  iVar1 = sock_init_with_ip((SOCKINFO *)&ret_code,sockfd,(sockaddr *)((long)args + 8));
  if (iVar1 == 0) {
    iVar1 = http_RecvMessage((SOCKINFO *)&ret_code,(http_parser_t *)&hmsg,HTTPMETHOD_UNKNOWN,
                             (int *)((long)&request + 4),&major);
    if (iVar1 == 0) {
      UpnpPrintf(UPNP_INFO,MSERV,".upnp/src/genlib/miniserver/miniserver.c",0x1aa,
                 "miniserver %d: PROCESSING...\n",(ulong)sockfd);
      major = dispatch_request((SOCKINFO *)&ret_code,(http_parser_t *)&hmsg);
      if (major == 0) {
        major = 0;
      }
    }
    if (0 < major) {
      if (phStack_2a0 != (http_message_t *)0x0) {
        parser.scanner._20_4_ = phStack_2a0->major_version;
        parser.scanner.entire_msg_loaded = phStack_2a0->minor_version;
      }
      handle_error((SOCKINFO *)&ret_code,major,parser.scanner._20_4_,
                   parser.scanner.entire_msg_loaded);
    }
    sock_destroy((SOCKINFO *)&ret_code,2);
    httpmsg_destroy(phStack_2a0);
    free(args);
    UpnpPrintf(UPNP_INFO,MSERV,".upnp/src/genlib/miniserver/miniserver.c",0x1c3,
               "miniserver %d: COMPLETE\n",(ulong)sockfd);
  }
  else {
    free(args);
    httpmsg_destroy(phStack_2a0);
  }
  return;
}

Assistant:

static void handle_request(
	/*! [in] Request Message to be handled. */
	void *args)
{
	SOCKINFO info;
	int http_error_code;
	int ret_code;
	int major = 1;
	int minor = 1;
	http_parser_t parser;
	http_message_t *hmsg = NULL;
	int timeout = HTTP_DEFAULT_TIMEOUT;
	struct mserv_request_t *request = (struct mserv_request_t *)args;
	SOCKET connfd = request->connfd;

	UpnpPrintf(UPNP_INFO,
		MSERV,
		__FILE__,
		__LINE__,
		"miniserver %d: READING\n",
		connfd);
	/* parser_request_init( &parser ); */ /* LEAK_FIX_MK */
	hmsg = &parser.msg;
	ret_code = sock_init_with_ip(
		&info, connfd, (struct sockaddr *)&request->foreign_sockaddr);
	if (ret_code != UPNP_E_SUCCESS) {
		free(request);
		httpmsg_destroy(hmsg);
		return;
	}
	/* read */
	ret_code = http_RecvMessage(
		&info, &parser, HTTPMETHOD_UNKNOWN, &timeout, &http_error_code);
	if (ret_code != 0) {
		goto error_handler;
	}
	UpnpPrintf(UPNP_INFO,
		MSERV,
		__FILE__,
		__LINE__,
		"miniserver %d: PROCESSING...\n",
		connfd);
	/* dispatch */
	http_error_code = dispatch_request(&info, &parser);
	if (http_error_code != 0) {
		goto error_handler;
	}
	http_error_code = 0;

error_handler:
	if (http_error_code > 0) {
		if (hmsg) {
			major = hmsg->major_version;
			minor = hmsg->minor_version;
		}
		handle_error(&info, http_error_code, major, minor);
	}
	sock_destroy(&info, SD_BOTH);
	httpmsg_destroy(hmsg);
	free(request);

	UpnpPrintf(UPNP_INFO,
		MSERV,
		__FILE__,
		__LINE__,
		"miniserver %d: COMPLETE\n",
		connfd);
}